

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xInstPrinter.c
# Opt level: O2

void printMemOperand2(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  byte bVar2;
  cs_detail *pcVar3;
  MCOperand *op;
  int64_t iVar4;
  long lVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  uint uVar7;
  
  op = MCInst_getOperand(MI,1);
  iVar4 = MCOperand_getImm(op);
  uVar7 = (uint)iVar4 & 0x7f;
  uVar6 = (uint)iVar4 >> 7 & 0x7fff;
  SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNo),"*+%s[0x%x]",
                 getRegisterName_AsmStrs +
                 *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar7 - 1) * 2),(ulong)uVar6);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    bVar2 = (pcVar3->field_6).x86.prefix[0];
    lVar5 = (ulong)bVar2 * 0x20;
    puVar1 = pcVar3->groups + lVar5 + 0x11;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(uint *)(pcVar3->groups + lVar5 + 0x15) = uVar7;
    puVar1 = pcVar3->groups + lVar5 + 0x1d;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(uint *)(pcVar3->groups + lVar5 + 0x19) = uVar6;
    puVar1 = pcVar3->groups + lVar5 + 0x25;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\x01';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = pcVar3->groups + lVar5 + 0x2d;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    (pcVar3->field_6).x86.prefix[0] = bVar2 + 1;
  }
  return;
}

Assistant:

static void printMemOperand2(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	int64_t Val = MCOperand_getImm(Op);
	uint16_t offset;
	unsigned basereg;
	cs_tms320c64x *tms320c64x;

	basereg = Val & 0x7f;
	offset = (Val >> 7) & 0x7fff;
	SStream_concat(O, "*+%s[0x%x]", getRegisterName(basereg), offset);

	if (MI->csh->detail) {
		tms320c64x = &MI->flat_insn->detail->tms320c64x;

		tms320c64x->operands[tms320c64x->op_count].type = TMS320C64X_OP_MEM;
		tms320c64x->operands[tms320c64x->op_count].mem.base = basereg;
		tms320c64x->operands[tms320c64x->op_count].mem.unit = 2;
		tms320c64x->operands[tms320c64x->op_count].mem.disp = offset;
		tms320c64x->operands[tms320c64x->op_count].mem.disptype = TMS320C64X_MEM_DISP_CONSTANT;
		tms320c64x->operands[tms320c64x->op_count].mem.direction = TMS320C64X_MEM_DIR_FW;
		tms320c64x->operands[tms320c64x->op_count].mem.modify = TMS320C64X_MEM_MOD_NO;
		tms320c64x->op_count++;
	}
}